

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

void * err_unwind(lua_State *L,void *stopcf,int errcode)

{
  byte *pbVar1;
  uint uVar2;
  code *pcVar3;
  lua_State *in_RAX;
  ulong uVar4;
  TValue *pTVar5;
  TValue *pTVar6;
  lua_State *plVar7;
  int iVar8;
  
  plVar7 = (lua_State *)L->cframe;
  pTVar5 = L->base + -1;
  do {
    if (plVar7 == (lua_State *)0x0) goto LAB_0010a255;
    iVar8 = *(int *)(((ulong)plVar7 & 0xfffffffffffffffc) + 0x10);
    if (iVar8 < 0) {
      pTVar6 = (TValue *)((ulong)(uint)-iVar8 + (ulong)(L->stack).ptr32);
      if (pTVar5 < pTVar6) {
        in_RAX = plVar7;
      }
      if (pTVar5 < pTVar6 && errcode != 0) {
        L->cframe = *(void **)&plVar7->maxstack;
        L->base = pTVar5 + 1;
        unwindstack(L,pTVar6);
        in_RAX = plVar7;
      }
      iVar8 = 1;
      if (pTVar6 <= pTVar5) goto LAB_0010a0fd;
      goto LAB_0010a1d7;
    }
LAB_0010a0fd:
    iVar8 = 3;
    if (pTVar5 <= (TValue *)(ulong)(L->stack).ptr32) goto LAB_0010a1d7;
    uVar2 = (pTVar5->field_2).it;
    switch(uVar2 & 7) {
    default:
      pTVar5 = pTVar5 + (-1 - (ulong)*(byte *)((ulong)uVar2 - 3));
      goto LAB_0010a1d4;
    case 1:
      goto switchD_0010a126_caseD_1;
    case 2:
      if (pTVar5[-1].u32.lo != 1) goto switchD_0010a126_caseD_3;
switchD_0010a126_caseD_1:
      if (errcode == 0) {
        if (plVar7 != (lua_State *)stopcf) {
          plVar7 = *(lua_State **)&plVar7->maxstack;
          uVar4 = (long)(int)uVar2 & 0xfffffffffffffff8;
LAB_0010a1d1:
          pTVar5 = (TValue *)((long)pTVar5 - uVar4);
LAB_0010a1d4:
          iVar8 = 0;
          break;
        }
      }
      else {
        L->cframe = *(void **)&plVar7->maxstack;
        L->base = (TValue *)
                  ((long)pTVar5 + (8 - ((long)(int)(pTVar5->field_2).it & 0xfffffffffffffff8U)));
        unwindstack(L,pTVar5);
      }
      iVar8 = 1;
      in_RAX = (lua_State *)0x0;
      break;
    case 3:
switchD_0010a126_caseD_3:
      uVar4 = (ulong)(int)(uVar2 & 0xfffffff8);
      goto LAB_0010a1d1;
    case 5:
      iVar8 = 1;
      if (((ulong)plVar7 & 1) == 0) {
        in_RAX = plVar7;
        if (errcode != 0) {
          L->cframe = *(void **)&plVar7->maxstack;
          L->base = (TValue *)
                    ((long)pTVar5 + (8 - ((long)(int)(pTVar5->field_2).it & 0xfffffffffffffff8U)));
          unwindstack(L,pTVar5);
        }
      }
      else {
        in_RAX = plVar7;
        if (errcode != 0) {
          pbVar1 = (byte *)((ulong)(L->glref).ptr32 + 0x91);
          *pbVar1 = *pbVar1 & 0xef;
          L->cframe = (void *)0x0;
          L->status = (uint8_t)errcode;
        }
      }
      break;
    case 6:
    case 7:
      if (errcode != 0) {
        if (errcode == 1) goto switchD_0010a126_caseD_3;
        if ((uVar2 & 7) == 6) {
          pbVar1 = (byte *)((ulong)(L->glref).ptr32 + 0x91);
          *pbVar1 = *pbVar1 & 0xef;
        }
        L->cframe = plVar7;
        pTVar6 = (TValue *)
                 ((long)pTVar5 + (8 - ((long)(int)(pTVar5->field_2).it & 0xfffffffffffffff8U)));
        L->base = pTVar6;
        unwindstack(L,pTVar6);
      }
      iVar8 = 1;
      in_RAX = (lua_State *)((ulong)plVar7 | 2);
    }
LAB_0010a1d7:
  } while (iVar8 == 0);
  if (iVar8 == 3) {
LAB_0010a255:
    in_RAX = L;
    if (errcode != 0) {
      L->cframe = (void *)0x0;
      pTVar5 = (TValue *)((ulong)(L->stack).ptr32 + 8);
      L->base = pTVar5;
      unwindstack(L,pTVar5);
      pcVar3 = *(code **)((ulong)(L->glref).ptr32 + 0xe0);
      if (pcVar3 != (code *)0x0) {
        (*pcVar3)(L);
      }
      exit(1);
    }
  }
  return in_RAX;
}

Assistant:

static void *err_unwind(lua_State *L, void *stopcf, int errcode)
{
  TValue *frame = L->base-1;
  void *cf = L->cframe;
  while (cf) {
    int32_t nres = cframe_nres(cframe_raw(cf));
    if (nres < 0) {  /* C frame without Lua frame? */
      TValue *top = restorestack(L, -nres);
      if (frame < top) {  /* Frame reached? */
	if (errcode) {
	  L->cframe = cframe_prev(cf);
	  L->base = frame+1;
	  unwindstack(L, top);
	}
	return cf;
      }
    }
    if (frame <= tvref(L->stack))
      break;
    switch (frame_typep(frame)) {
    case FRAME_LUA:  /* Lua frame. */
    case FRAME_LUAP:
      frame = frame_prevl(frame);
      break;
    case FRAME_C:  /* C frame. */
#if LJ_HASFFI
    unwind_c:
#endif
#if LJ_UNWIND_EXT
      if (errcode) {
	L->cframe = cframe_prev(cf);
	L->base = frame_prevd(frame) + 1;
	unwindstack(L, frame);
      } else if (cf != stopcf) {
	cf = cframe_prev(cf);
	frame = frame_prevd(frame);
	break;
      }
      return NULL;  /* Continue unwinding. */
#else
      UNUSED(stopcf);
      cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
#endif
    case FRAME_CP:  /* Protected C frame. */
      if (cframe_canyield(cf)) {  /* Resume? */
	if (errcode) {
	  hook_leave(G(L));  /* Assumes nobody uses coroutines inside hooks. */
	  L->cframe = NULL;
	  L->status = (uint8_t)errcode;
	}
	return cf;
      }
      if (errcode) {
	L->cframe = cframe_prev(cf);
	L->base = frame_prevd(frame) + 1;
	unwindstack(L, frame);
      }
      return cf;
    case FRAME_CONT:  /* Continuation frame. */
#if LJ_HASFFI
      if ((frame-1)->u32.lo == LJ_CONT_FFI_CALLBACK)
	goto unwind_c;
#endif
    case FRAME_VARG:  /* Vararg frame. */
      frame = frame_prevd(frame);
      break;
    case FRAME_PCALL:  /* FF pcall() frame. */
    case FRAME_PCALLH:  /* FF pcall() frame inside hook. */
      if (errcode) {
	if (errcode == LUA_YIELD) {
	  frame = frame_prevd(frame);
	  break;
	}
	if (frame_typep(frame) == FRAME_PCALL)
	  hook_leave(G(L));
	L->cframe = cf;
	L->base = frame_prevd(frame) + 1;
	unwindstack(L, L->base);
      }
      return (void *)((intptr_t)cf | CFRAME_UNWIND_FF);
    }
  }
  /* No C frame. */
  if (errcode) {
    L->cframe = NULL;
    L->base = tvref(L->stack)+1;
    unwindstack(L, L->base);
    if (G(L)->panic)
      G(L)->panic(L);
    exit(EXIT_FAILURE);
  }
  return L;  /* Anything non-NULL will do. */
}